

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O3

intptr_t fiobj_data_write(FIOBJ io,void *buffer,uintptr_t length)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  ssize_t sVar4;
  int __fd;
  stat local_c0;
  
  if ((((io == 0) || ((~(uint)io & 6) == 0 || (io & 1) != 0)) ||
      (*(char *)(io & 0xfffffffffffffff8) != '+')) || (length != 0 && buffer == (void *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    length = 0xffffffffffffffff;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    __fd = *(int *)(io + 0x30);
    if (__fd == -2) {
      fiobj_data_assert_dynamic(io);
      __fd = *(int *)(io + 0x30);
    }
    if (__fd != -1) {
      do {
        iVar1 = fstat(*(int *)(io + 0x30),&local_c0);
        if (iVar1 == 0) goto LAB_00141899;
      } while (*piVar2 == 4);
      local_c0.st_size = -1;
LAB_00141899:
      sVar4 = pwrite(__fd,buffer,length,local_c0.st_size);
      return sVar4;
    }
    fiobj_data_pre_write(io,length + 1);
    memcpy((void *)(*(long *)(io + 8) + *(long *)(io + 0x20)),buffer,length);
    lVar3 = *(long *)(io + 0x20) + length;
    *(long *)(io + 0x20) = lVar3;
    *(undefined1 *)(*(long *)(io + 8) + lVar3) = 0;
  }
  return length;
}

Assistant:

intptr_t fiobj_data_write(FIOBJ io, void *buffer, uintptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA) || (!buffer && length)) {
    errno = EFAULT;
    return -1;
  }
  errno = 0;
  /* Unslice slices */
  if (obj2io(io)->fd == -2)
    fiobj_data_assert_dynamic(io);

  if (obj2io(io)->fd == -1) {
    /* String Code */
    fiobj_data_pre_write(io, length + 1);
    memcpy(obj2io(io)->buffer + obj2io(io)->len, buffer, length);
    obj2io(io)->len = obj2io(io)->len + length;
    obj2io(io)->buffer[obj2io(io)->len] = 0;
    return length;
  }

  /* File Code */
  return pwrite(obj2io(io)->fd, buffer, length, fiobj_data_get_fd_size(io));
}